

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::ReadDoubleVector
          (CrateReader *this,vector<double,_std::allocator<double>_> *d)

{
  StreamReader *this_00;
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  void *__buf;
  double *__nbytes;
  ssize_t sVar4;
  string local_360;
  ostringstream local_340 [8];
  ostringstream ss_e_1;
  string local_1c8;
  ostringstream local_1a8 [8];
  ostringstream ss_e;
  ulong local_30;
  uint64_t n;
  size_t length;
  vector<double,_std::allocator<double>_> *d_local;
  CrateReader *this_local;
  
  length = (size_t)d;
  d_local = (vector<double,_std::allocator<double>_> *)this;
  bVar1 = StreamReader::read8(this->_sr,&local_30);
  if (bVar1) {
    n = local_30;
    if (local_30 == 0) {
      ::std::vector<double,_std::allocator<double>_>::clear
                ((vector<double,_std::allocator<double>_> *)length);
      this_local._7_1_ = 1;
    }
    else if ((this->_config).maxArrayElements < local_30) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadDoubleVector");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x311);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1a8,"Too many array elements.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_1c8);
      ::std::__cxx11::string::~string((string *)&local_1c8);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    }
    else {
      this->_memoryUsage = local_30 * 8 + this->_memoryUsage;
      if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
        ::std::__cxx11::ostringstream::ostringstream(local_340);
        poVar2 = ::std::operator<<((ostream *)local_340,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[Crate]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadDoubleVector");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x314);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_340,"Reached to max memory budget.");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_360);
        ::std::__cxx11::string::~string((string *)&local_360);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_340);
      }
      else {
        ::std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)length,local_30);
        this_00 = this->_sr;
        lVar3 = n << 3;
        __buf = (void *)(n << 3);
        __nbytes = ::std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)length);
        sVar4 = StreamReader::read(this_00,(int)lVar3,__buf,(size_t)__nbytes);
        if (sVar4 == 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)&this->_err,"Failed to read double vector data.\n");
          this_local._7_1_ = 0;
        }
        else {
          this_local._7_1_ = 1;
        }
      }
    }
  }
  else {
    ::std::__cxx11::string::operator+=
              ((string *)&this->_err,"Failed to read the number of array elements.\n");
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadDoubleVector(std::vector<double> *d) {
  size_t length;

  uint64_t n;
  if (!_sr->read8(&n)) {
    _err += "Failed to read the number of array elements.\n";
    return false;
  }

  length = size_t(n);

  if (length == 0) {
    d->clear();
    return true;
  }

  if (length > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  CHECK_MEMORY_USAGE(length * sizeof(double));

  d->resize(length);

  // TODO(syoyo): Zero-copy
  if (!_sr->read(sizeof(double) * length, sizeof(double) * length,
                 reinterpret_cast<uint8_t *>(d->data()))) {
    _err += "Failed to read double vector data.\n";
    return false;
  }

  return true;
}